

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O2

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>::~COpenGLCoreTexture
          (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *this)

{
  ~COpenGLCoreTexture((COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *)
                      ((long)&(this->super_ITexture)._vptr_ITexture +
                      (long)(this->super_ITexture)._vptr_ITexture[-3]));
  return;
}

Assistant:

virtual ~COpenGLCoreTexture()
	{
		if (TextureName)
			GL.DeleteTextures(1, &TextureName);

		if (LockImage)
			LockImage->drop();

		for (u32 i = 0; i < Images.size(); ++i)
			Images[i]->drop();
	}